

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sz_huffman.cpp
# Opt level: O0

void unpad_tree_uint(HuffmanTree *huffmanTree,uint *L,uint *R,uint *C,uchar *t,uint i,node root)

{
  node pnVar1;
  uint *in_RCX;
  uint *in_RDX;
  HuffmanTree *in_RSI;
  HuffmanTree *in_RDI;
  uint *in_R8;
  uint in_R9D;
  node unaff_retaddr;
  undefined8 *in_stack_00000008;
  node rroot;
  node lroot;
  uint r;
  uint l;
  uint in_stack_ffffffffffffffcc;
  uint i_00;
  uint uVar2;
  
  if (*(char *)(in_stack_00000008 + 3) == '\0') {
    uVar2 = (&in_RSI->stateNum)[in_R9D];
    if (uVar2 != 0) {
      pnVar1 = new_node2(in_RDI,in_RCX[uVar2],*(uchar *)((long)in_R8 + (ulong)uVar2));
      *in_stack_00000008 = pnVar1;
      unpad_tree_uint(in_RSI,in_RDX,in_RCX,in_R8,(uchar *)CONCAT44(in_R9D,uVar2),
                      in_stack_ffffffffffffffcc,unaff_retaddr);
    }
    i_00 = in_RDX[in_R9D];
    if (i_00 != 0) {
      pnVar1 = new_node2(in_RDI,in_RCX[i_00],*(uchar *)((long)in_R8 + (ulong)i_00));
      in_stack_00000008[1] = pnVar1;
      unpad_tree_uint(in_RSI,in_RDX,in_RCX,in_R8,(uchar *)CONCAT44(in_R9D,uVar2),i_00,unaff_retaddr)
      ;
    }
  }
  return;
}

Assistant:

void unpad_tree_uint(HuffmanTree* huffmanTree, unsigned int* L, unsigned int* R, unsigned int* C, unsigned char* t, unsigned int i, node root)
{
	//root->c = C[i];
	if(root->t==0)
	{
		unsigned int l, r;
		l = L[i];
		if(l!=0)
		{
			node lroot = new_node2(huffmanTree,C[l],t[l]);
			root->left = lroot;
			unpad_tree_uint(huffmanTree,L,R,C,t,l,lroot);
		}
		r = R[i];
		if(r!=0)
		{
			node rroot = new_node2(huffmanTree,C[r],t[r]);
			root->right = rroot;
			unpad_tree_uint(huffmanTree,L,R,C,t,r,rroot);
		}
	}
}